

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::ArgMinMaxBase<duckdb::LessThan,_true>::Bind
          (ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  PhysicalType PVar1;
  pointer pEVar2;
  LogicalType *in_RSI;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  size_type in_stack_ffffffffffffffb8;
  LogicalType *__n;
  LogicalType *in_stack_ffffffffffffffc0;
  LogicalType *in_stack_ffffffffffffffc8;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> context_00;
  
  context_00._M_head_impl =
       (FunctionData *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_ffffffffffffffc0);
  PVar1 = LogicalType::InternalType(&pEVar2->return_type);
  if (PVar1 == VARCHAR) {
    in_stack_ffffffffffffffc8 =
         (LogicalType *)
         vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
         ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                       *)in_RSI,in_stack_ffffffffffffffb8);
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_RSI,in_stack_ffffffffffffffb8);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_RSI);
    ExpressionBinder::PushCollation
              ((ClientContext *)context_00._M_head_impl,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_ffffffffffffffc8,in_RSI,(CollationType)(in_stack_ffffffffffffffb8 >> 0x20));
    in_stack_ffffffffffffffc0 = in_RSI;
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_ffffffffffffffc0);
  __n = &pEVar2->return_type;
  vector<duckdb::LogicalType,_true>::operator[]
            ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffffc0,(size_type)__n);
  LogicalType::operator=(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_ffffffffffffffc0,(size_type)__n);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_ffffffffffffffc0);
  LogicalType::operator=(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<std::default_delete<duckdb::FunctionData>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             in_stack_ffffffffffffffc0,__n);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> Bind(ClientContext &context, AggregateFunction &function,
	                                     vector<unique_ptr<Expression>> &arguments) {
		if (arguments[1]->return_type.InternalType() == PhysicalType::VARCHAR) {
			ExpressionBinder::PushCollation(context, arguments[1], arguments[1]->return_type);
		}
		function.arguments[0] = arguments[0]->return_type;
		function.return_type = arguments[0]->return_type;
		return nullptr;
	}